

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternAddressMapper.cpp
# Opt level: O3

void __thiscall
PatternAddressMapper::compute_mapping_stats
          (PatternAddressMapper *this,
          vector<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>
          *agg_access_patterns,int *agg_intra_distance,int *agg_inter_distance,
          bool uses_seq_addresses)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pAVar3;
  pointer pAVar4;
  pointer pAVar5;
  int iVar6;
  pointer pAVar7;
  iterator iVar8;
  undefined8 uVar9;
  long lVar10;
  __hashtable *__h;
  pointer pAVar11;
  long lVar12;
  vector<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_> *__range1;
  __hashtable *__h_2;
  pointer pAVar13;
  char *args;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Deriving mapping parameters from AggressorAccessPatterns.","");
  Logger::log_info(&local_50,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  *agg_intra_distance = 0;
  pAVar3 = (agg_access_patterns->
           super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  pAVar11 = (agg_access_patterns->
            super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pAVar7 = pAVar11;
  for (pAVar13 = pAVar11; pAVar13 != pAVar3; pAVar13 = pAVar13 + 1) {
    pAVar4 = (pAVar13->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl
             .super__Vector_impl_data._M_start;
    if (4 < (ulong)((long)(pAVar13->aggressors).
                          super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pAVar4)) {
      pAVar11 = (pointer)&this->aggressor_to_addr;
      iVar8 = std::
              _Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)pAVar11,&pAVar4[1].id);
      if (iVar8.super__Node_iterator_base<std::pair<const_int,_DRAMAddr>,_false>._M_cur ==
          (__node_type *)0x0) goto LAB_0013e085;
      pAVar4 = (pAVar13->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((pAVar13->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
          super__Vector_impl_data._M_finish == pAVar4) goto LAB_0013e091;
      uVar9 = *(undefined8 *)
               ((long)iVar8.super__Node_iterator_base<std::pair<const_int,_DRAMAddr>,_false>._M_cur
               + 0x18);
      iVar8 = std::
              _Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)pAVar11,&pAVar4->id);
      if (iVar8.super__Node_iterator_base<std::pair<const_int,_DRAMAddr>,_false>._M_cur ==
          (__node_type *)0x0) goto LAB_0013e085;
      *agg_intra_distance =
           (int)uVar9 -
           *(int *)((long)iVar8.super__Node_iterator_base<std::pair<const_int,_DRAMAddr>,_false>.
                          _M_cur + 0x18);
      pAVar11 = (agg_access_patterns->
                super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      pAVar7 = (agg_access_patterns->
               super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      break;
    }
    pAVar7 = pAVar3;
  }
  *agg_inter_distance = -1;
  pAVar11 = pAVar11 + 1;
  if (pAVar11 != pAVar7) {
    do {
      pAVar4 = (pAVar11 + -2)[1].aggressors.
               super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
               super__Vector_impl_data._M_start;
      pAVar5 = *(pointer *)
                ((long)&(pAVar11 + -2)[1].aggressors.
                        super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
                        super__Vector_impl_data + 8);
      lVar10 = (long)pAVar5 - (long)pAVar4 >> 2;
      lVar12 = lVar10 + -1;
      if (pAVar5 == pAVar4) goto LAB_0013e0a5;
      iVar8 = std::
              _Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->aggressor_to_addr)._M_h,&pAVar4[lVar12].id);
      if (iVar8.super__Node_iterator_base<std::pair<const_int,_DRAMAddr>,_false>._M_cur ==
          (__node_type *)0x0) goto LAB_0013e085;
      pAVar4 = (pAVar11->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((pAVar11->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
          super__Vector_impl_data._M_finish == pAVar4) goto LAB_0013e091;
      uVar9 = *(undefined8 *)
               ((long)iVar8.super__Node_iterator_base<std::pair<const_int,_DRAMAddr>,_false>._M_cur
               + 0x18);
      iVar8 = std::
              _Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->aggressor_to_addr)._M_h,&pAVar4->id);
      if (iVar8.super__Node_iterator_base<std::pair<const_int,_DRAMAddr>,_false>._M_cur ==
          (__node_type *)0x0) goto LAB_0013e085;
      iVar6 = *(int *)((long)iVar8.super__Node_iterator_base<std::pair<const_int,_DRAMAddr>,_false>.
                             _M_cur + 0x18) - (int)uVar9;
      if (*agg_inter_distance == -1) {
        *agg_inter_distance = iVar6;
      }
      else if (*agg_inter_distance != iVar6) {
        args = "false";
        goto LAB_0013df43;
      }
      pAVar11 = pAVar11 + 1;
    } while (pAVar11 !=
             (agg_access_patterns->
             super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>).
             _M_impl.super__Vector_impl_data._M_finish);
  }
  args = "true";
LAB_0013df43:
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"inter-distance v = %d","");
  paVar2 = &local_50.field_2;
  format_string<int>(&local_50,&local_70,*agg_inter_distance);
  Logger::log_data(&local_50,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"intra-distance d = %d","");
  format_string<int>(&local_50,&local_70,*agg_intra_distance);
  Logger::log_data(&local_50,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"use_seq_addresses = %s","");
  format_string<char_const*>(&local_50,&local_70,args);
  Logger::log_data(&local_50,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
LAB_0013e085:
  std::__throw_out_of_range("_Map_base::at");
LAB_0013e091:
  lVar12 = 0;
  lVar10 = 0;
LAB_0013e0a5:
  uVar9 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     lVar12,lVar10);
  if ((pointer)local_50._M_dataplus._M_p != pAVar11) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((vector<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_> *)
      local_70._M_dataplus._M_p != agg_access_patterns) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(uVar9);
}

Assistant:

void PatternAddressMapper::compute_mapping_stats(std::vector<AggressorAccessPattern> &agg_access_patterns,
                                                 int &agg_intra_distance, int &agg_inter_distance,
                                                 bool uses_seq_addresses) {
  Logger::log_info("Deriving mapping parameters from AggressorAccessPatterns.");

  // find first AggressorAccessPattern with more than one aggressor, then compute distance in-between aggressors
  agg_intra_distance = 0;
  for (auto &agg_access_pattern : agg_access_patterns) {
    if (agg_access_pattern.aggressors.size() > 1) {
      auto r1 = aggressor_to_addr.at(agg_access_pattern.aggressors.at(1).id).row;
      auto r0 = aggressor_to_addr.at(agg_access_pattern.aggressors.at(0).id).row;
      agg_intra_distance = static_cast<int>(r1-r0);
      break;
    }
  }

  // if all consecutive AggressorAccessPatterns have the same inter-distance, then they use "sequential addresses"
  uses_seq_addresses = true;
  agg_inter_distance = -1;
  for (auto it = agg_access_patterns.begin(); it+1 != agg_access_patterns.end(); ++it) {
    auto this_size = it->aggressors.size();
    auto this_row = aggressor_to_addr.at(it->aggressors.at(this_size-1).id).row;
    auto next_row = aggressor_to_addr.at((it+1)->aggressors.at(0).id).row;
    auto distance = static_cast<int>(next_row - this_row);
    if (agg_inter_distance == -1) {
        agg_inter_distance = distance;
    } else if (agg_inter_distance != distance) {
      uses_seq_addresses = false;
      break;
    }
  }

  Logger::log_data(format_string("inter-distance v = %d", agg_inter_distance));
  Logger::log_data(format_string("intra-distance d = %d", agg_intra_distance));
  Logger::log_data(format_string("use_seq_addresses = %s", (uses_seq_addresses ? "true" : "false")));
}